

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O2

__m256i * boxsum_from_ii(__m256i *__return_storage_ptr__,int32_t *ii,int stride,int r)

{
  undefined1 auVar1 [32];
  long lVar2;
  long lVar3;
  
  lVar2 = (long)((stride + 1) * (int)ii);
  lVar3 = (long)(stride * (int)ii);
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])
                        ((long)__return_storage_ptr__ + lVar2 * -4 + (long)stride * 4),
                       *(undefined1 (*) [32])
                        ((long)*__return_storage_ptr__ + lVar3 * 4 + (long)~stride * 4));
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])
                        ((long)__return_storage_ptr__ + lVar2 * -4 + (long)~stride * 4),auVar1);
  vpaddd_avx2(auVar1,*(undefined1 (*) [32])
                      ((long)*__return_storage_ptr__ + lVar3 * 4 + (long)stride * 4));
  return (__m256i *)(lVar2 * 4);
}

Assistant:

static inline __m256i boxsum_from_ii(const int32_t *ii, int stride, int r) {
  const __m256i tl = yy_loadu_256(ii - (r + 1) - (r + 1) * stride);
  const __m256i tr = yy_loadu_256(ii + (r + 0) - (r + 1) * stride);
  const __m256i bl = yy_loadu_256(ii - (r + 1) + r * stride);
  const __m256i br = yy_loadu_256(ii + (r + 0) + r * stride);
  const __m256i u = _mm256_sub_epi32(tr, tl);
  const __m256i v = _mm256_sub_epi32(br, bl);
  return _mm256_sub_epi32(v, u);
}